

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::setControlLowerBound
          (OptimalControlProblem *this,VectorDynSize *minControl)

{
  bool bVar1;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *__r;
  element_type *this_00;
  shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *psVar2;
  shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>_> *in_RDI;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)
                     ((in_RDI->
                      super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr + 3));
  if (bVar1) {
    __r = (shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *)
          iDynTree::VectorDynSize::size();
    this_00 = std::
              __shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::DynamicalSystem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x2fcb9e);
    psVar2 = (shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_> *)
             DynamicalSystem::controlSpaceSize(this_00);
    if (__r == psVar2) {
      *(undefined1 *)
       ((long)&(in_RDI->
               super___shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr[0x11]._vptr_TimeVaryingObject + 2) = 1;
      std::
      make_shared<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>,iDynTree::VectorDynSize_const&>
                ((VectorDynSize *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      std::shared_ptr<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>>::
      operator=(in_RDI,__r);
      std::shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_>::
      ~shared_ptr((shared_ptr<iDynTree::optimalcontrol::TimeInvariantObject<iDynTree::VectorDynSize>_>
                   *)0x2fcc14);
      bVar1 = true;
    }
    else {
      iDynTree::reportError
                ("OptimalControlProblem","setControlLowerBound",
                 "The dimension of minControl does not coincide with the control dimension.");
      bVar1 = false;
    }
  }
  else {
    iDynTree::reportError
              ("OptimalControlProblem","setControlLowerBound",
               "First a dynamical system has to be set.");
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool OptimalControlProblem::setControlLowerBound(const VectorDynSize &minControl)
        {
            if (!(m_pimpl->dynamicalSystem)){
                reportError("OptimalControlProblem", "setControlLowerBound", "First a dynamical system has to be set.");
                return false;
            }

            if (minControl.size() != m_pimpl->dynamicalSystem->controlSpaceSize()) {
                reportError("OptimalControlProblem", "setControlLowerBound", "The dimension of minControl does not coincide with the control dimension.");
                return false;
            }

            m_pimpl->controlLowerBounded = true;
            m_pimpl->controlLowerBound = std::make_shared<TimeInvariantVector>(minControl);

            return true;
        }